

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

int rottenfood(obj *obj)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *local_38;
  char *local_28;
  char *where;
  char *what;
  obj *obj_local;
  
  pcVar4 = foodword(obj);
  pline("Blecch!  Rotten %s!",pcVar4);
  iVar3 = rn2(4);
  if (iVar3 == 0) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      pcVar4 = body_part(10);
      pline("You feel rather %s.",pcVar4);
    }
    else {
      pline("You feel rather trippy.");
    }
    uVar1 = u.uprops[0x1c].intrinsic;
    iVar3 = dice(2,4);
    make_confused((ulong)(uVar1 + iVar3),'\0');
  }
  else {
    iVar3 = rn2(4);
    if ((iVar3 == 0) &&
       (((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      pline("Everything suddenly goes dark.");
      iVar3 = dice(2,10);
      make_blinded((long)iVar3,'\0');
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pline("Your vision quickly clears.");
      }
    }
    else {
      iVar3 = rn2(3);
      if (iVar3 == 0) {
        if ((((u.uprops[0x1e].intrinsic == 0) &&
             ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          where = "goes";
          local_28 = "dark";
        }
        else if ((((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
                 ((youmonst.data)->mlet != '\x05')) &&
                ((bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar2 == '\0' &&
                 (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0')))) {
          where = "you slap against the";
          if (u.usteed == (monst *)0x0) {
            local_38 = surface((int)u.ux,(int)u.uy);
          }
          else {
            local_38 = "saddle";
          }
          local_28 = local_38;
        }
        else {
          where = "you lose control of";
          local_28 = "yourself";
        }
        pline("The world spins and %s %s.",where,local_28);
        flags.soundok = '\0';
        iVar3 = rnd(10);
        nomul(-iVar3,"unconscious from rotten food");
        nomovemsg = "You are conscious again.";
        afternmv = Hear_again;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int rottenfood(struct obj *obj)
{
	pline("Blecch!  Rotten %s!", foodword(obj));
	if (!rn2(4)) {
		if (Hallucination) pline("You feel rather trippy.");
		else pline("You feel rather %s.", body_part(LIGHT_HEADED));
		make_confused(HConfusion + dice(2,4), FALSE);
	} else if (!rn2(4) && !Blind) {
		pline("Everything suddenly goes dark.");
		make_blinded((long)dice(2,10), FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	} else if (!rn2(3)) {
		const char *what, *where;
		if (!Blind)
		    what = "goes",  where = "dark";
		else if (Levitation || Is_airlevel(&u.uz) ||
			 Is_waterlevel(&u.uz))
		    what = "you lose control of",  where = "yourself";
		else
		    what = "you slap against the", where =
			   (u.usteed) ? "saddle" :
			   surface(u.ux,u.uy);
		pline("The world spins and %s %s.", what, where);
		flags.soundok = 0;
		nomul(-rnd(10), "unconscious from rotten food");
		nomovemsg = "You are conscious again.";
		afternmv = Hear_again;
		return 1;
	}
	return 0;
}